

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

date_t duckdb::DateTrunc::
       UnaryFunction<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::DayOperator>
                 (timestamp_t input)

{
  bool bVar1;
  date_t dVar2;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar1) {
    dVar2 = Timestamp::GetDate(input);
    return (date_t)dVar2.days;
  }
  dVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::date_t>(input);
  return (date_t)dVar2.days;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}